

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int exprCodeSubselect(Parse *pParse,Expr *pExpr)

{
  Vdbe *p;
  Select *p_00;
  sqlite3 *db;
  u8 uVar1;
  int addr;
  Expr *pEVar2;
  Expr *pLeft;
  int iVar3;
  char *pcVar4;
  int iVar5;
  long in_FS_OFFSET;
  undefined1 auStack_68 [12];
  undefined8 uStack_5c;
  undefined4 uStack_54;
  char *pcStack_50;
  ExprList *pEStack_48;
  long lStack_38;
  
  if (pExpr->op != 0x8b) {
    return 0;
  }
  lStack_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = 0;
  if (pParse->nErr == 0) {
    p = pParse->pVdbe;
    pEStack_48 = (ExprList *)&DAT_aaaaaaaaaaaaaaaa;
    uStack_54 = 0xaaaaaaaa;
    pcStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    auStack_68._0_4_ = 0xaaaaaaaa;
    auStack_68._4_4_ = -0x55555556;
    auStack_68._8_4_ = -0x55555556;
    uStack_5c = &DAT_aaaaaaaaaaaaaaaa;
    p_00 = (pExpr->x).pSelect;
    if ((pExpr->flags >> 0x19 & 1) == 0) {
      pExpr->flags = pExpr->flags | 0x2000000;
      iVar3 = pParse->nMem + 1;
      pParse->nMem = iVar3;
      (pExpr->y).sub.regReturn = iVar3;
      addr = 0;
      iVar3 = sqlite3VdbeAddOp2(p,0x4a,0,iVar3);
      (pExpr->y).sub.iAddr = iVar3 + 1;
      if ((pExpr->flags & 0x40) == 0) {
        addr = sqlite3VdbeAddOp0(p,0xf);
      }
      pcVar4 = "";
      if (addr == 0) {
        pcVar4 = "CORRELATED ";
      }
      iVar3 = 1;
      sqlite3VdbeExplain(pParse,'\x01',"%sSCALAR SUBQUERY %d",pcVar4,(ulong)p_00->selId);
      uVar1 = pExpr->op;
      if (uVar1 == 0x8b) {
        iVar3 = p_00->pEList->nExpr;
      }
      auStack_68._8_4_ = 0;
      pcStack_50 = (char *)0x0;
      auStack_68._4_4_ = pParse->nMem + 1;
      uStack_5c = (undefined1 *)0x0;
      iVar5 = pParse->nMem + iVar3;
      pParse->nMem = iVar5;
      if (uVar1 == 0x8b) {
        uStack_5c = (undefined1 *)CONCAT44(iVar3,auStack_68._4_4_);
        sqlite3VdbeAddOp3(p,0x4b,0,auStack_68._4_4_,iVar5);
        uVar1 = '\n';
      }
      else {
        sqlite3VdbeAddOp2(p,0x47,0,auStack_68._4_4_);
        uVar1 = '\x03';
      }
      auStack_68[0] = uVar1;
      db = pParse->db;
      if (p_00->pLimit == (Expr *)0x0) {
        pEVar2 = sqlite3Expr(db,0x9c,"1");
        pEVar2 = sqlite3PExpr(pParse,0x95,pEVar2,(Expr *)0x0);
        p_00->pLimit = pEVar2;
      }
      else {
        pEVar2 = sqlite3Expr(db,0x9c,"0");
        if (pEVar2 == (Expr *)0x0) {
          pEVar2 = (Expr *)0x0;
        }
        else {
          pEVar2->affExpr = 'C';
          pLeft = sqlite3ExprDup(db,p_00->pLimit->pLeft,0);
          pEVar2 = sqlite3PExpr(pParse,0x35,pLeft,pEVar2);
        }
        sqlite3ExprDeferredDelete(pParse,p_00->pLimit->pLeft);
        p_00->pLimit->pLeft = pEVar2;
      }
      p_00->iLimit = 0;
      iVar5 = sqlite3Select(pParse,p_00,(SelectDest *)auStack_68);
      iVar3 = auStack_68._4_4_;
      if (iVar5 == 0) {
        pExpr->iTable = auStack_68._4_4_;
        if (addr != 0) {
          sqlite3VdbeJumpHere(p,addr);
        }
        sqlite3VdbeAddOp3(p,0x43,(pExpr->y).sub.regReturn,(pExpr->y).sub.iAddr,1);
        pParse->nTempReg = '\0';
        pParse->nRangeReg = 0;
      }
      else {
        pExpr->op2 = pExpr->op;
        pExpr->op = 0xb6;
        iVar3 = 0;
      }
    }
    else {
      sqlite3VdbeExplain(pParse,'\0',"REUSE SUBQUERY %d",(ulong)p_00->selId);
      sqlite3VdbeAddOp2(p,10,(pExpr->y).sub.regReturn,(pExpr->y).sub.iAddr);
      iVar3 = pExpr->iTable;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lStack_38) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

static int exprCodeSubselect(Parse *pParse, Expr *pExpr){
  int reg = 0;
#ifndef SQLITE_OMIT_SUBQUERY
  if( pExpr->op==TK_SELECT ){
    reg = sqlite3CodeSubselect(pParse, pExpr);
  }
#endif
  return reg;
}